

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

string * __thiscall re2::Prog::Dump_abi_cxx11_(string *__return_storage_ptr__,Prog *this)

{
  Deleter DVar1;
  long lVar2;
  _Head_base<0UL,_int_*,_false> in_RCX;
  Workq q;
  undefined1 local_38 [24];
  _Head_base<1UL,_re2::PODArray<int>::Deleter,_false> local_20;
  _Head_base<0UL,_int_*,_false> local_18;
  
  if (this->did_flatten_ == true) {
    FlattenedProgToString_abi_cxx11_
              (__return_storage_ptr__,(re2 *)this,(Prog *)(ulong)(uint)this->start_,
               (int)in_RCX._M_head_impl);
  }
  else {
    SparseSetT<void>::SparseSetT((SparseSetT<void> *)local_38,this->size_);
    DVar1.len_ = this->start_;
    lVar2 = (long)DVar1.len_;
    if (((lVar2 != 0) &&
        (in_RCX._M_head_impl = local_18._M_head_impl, (Workq *)local_18._M_head_impl != (Workq *)0x0
        )) && ((uint)DVar1.len_ < (uint)local_20._M_head_impl.len_)) {
      if (((uint)local_38._0_4_ <= *(uint *)(local_38._16_8_ + lVar2 * 4)) ||
         (local_18._M_head_impl[(int)*(uint *)(local_38._16_8_ + lVar2 * 4)] != DVar1.len_)) {
        *(undefined4 *)(local_38._16_8_ + lVar2 * 4) = local_38._0_4_;
        local_18._M_head_impl[(int)local_38._0_4_] = DVar1.len_;
        local_38._0_4_ = local_38._0_4_ + 1;
      }
    }
    ProgToString_abi_cxx11_
              (__return_storage_ptr__,(re2 *)this,(Prog *)local_38,(Workq *)in_RCX._M_head_impl);
    SparseSetT<void>::~SparseSetT((SparseSetT<void> *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Prog::Dump() {
  if (did_flatten_)
    return FlattenedProgToString(this, start_);

  Workq q(size_);
  AddToQueue(&q, start_);
  return ProgToString(this, &q);
}